

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall Renderer::Render(Renderer *this,Snake *snake,SDL_Point *food)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pSVar3;
  undefined8 uVar4;
  char *pcVar5;
  int iVar6;
  SDL_Point *point;
  pointer pSVar7;
  int iVar8;
  SDL_Renderer *pSVar9;
  undefined8 local_38;
  int local_30;
  int iStack_2c;
  
  iVar6 = (int)(this->screen_width / this->grid_width);
  iVar8 = (int)(this->screen_height / this->grid_height);
  local_30 = iVar6;
  iStack_2c = iVar8;
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff,0xff);
  SDL_RenderClear(this->sdl_renderer);
  local_38 = CONCAT44(iVar8 * food->y,iVar6 * food->x);
  if (Game::food_counter == 0 || (Game::food_counter & 3U) != 0) {
    pcVar5 = "../resources/elikoptero.bmp";
    if (Game::food_counter % 9 != 0) {
      pcVar5 = "../resources/cash.bmp";
    }
    if (Game::food_counter == 0) {
      pcVar5 = "../resources/cash.bmp";
    }
  }
  else {
    pcVar5 = "../resources/kotero.bmp";
  }
  pSVar9 = this->sdl_renderer;
  uVar4 = SDL_RWFromFile(pcVar5,"rb");
  uVar4 = SDL_LoadBMP_RW(uVar4,1);
  uVar4 = SDL_CreateTextureFromSurface(pSVar9,uVar4);
  SDL_RenderCopy(pSVar9,uVar4,0,&local_38);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xea,0xaa,0,0xff);
  pSVar3 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar7 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar7 != pSVar3; pSVar7 = pSVar7 + 1) {
    local_38 = CONCAT44(iStack_2c * pSVar7->y,local_30 * pSVar7->x);
    SDL_RenderFillRect(this->sdl_renderer,&local_38);
  }
  uVar1 = snake->head_x;
  uVar2 = snake->head_y;
  local_38 = CONCAT44((int)(float)uVar2 * iStack_2c,local_30 * (int)(float)uVar1);
  if (snake->alive == false) {
    SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0,0,0xff);
    SDL_RenderFillRect(this->sdl_renderer,&local_38);
  }
  else {
    switch(snake->direction) {
    case kUp:
      pSVar9 = this->sdl_renderer;
      pcVar5 = "../resources/madclip-top.bmp";
      break;
    case kDown:
      pSVar9 = this->sdl_renderer;
      pcVar5 = "../resources/madclip-down.bmp";
      break;
    case kLeft:
      pSVar9 = this->sdl_renderer;
      pcVar5 = "../resources/madclip-left.bmp";
      break;
    case kRight:
      pSVar9 = this->sdl_renderer;
      pcVar5 = "../resources/madclip-right.bmp";
      break;
    default:
      goto switchD_00103954_default;
    }
    uVar4 = SDL_RWFromFile(pcVar5,"rb");
    uVar4 = SDL_LoadBMP_RW(uVar4,1);
    uVar4 = SDL_CreateTextureFromSurface(pSVar9,uVar4);
    SDL_RenderCopy(pSVar9,uVar4,0,&local_38);
  }
switchD_00103954_default:
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render(Snake const snake, SDL_Point const &food) {
  SDL_Rect block;
  double degrees;
  block.w = screen_width / (grid_width);
  block.h = screen_height / (grid_height);

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  SDL_RenderClear(sdl_renderer);

  // Render food
  block.x = food.x * block.w;
  block.y = food.y * block.h;


  //rendering special food
  if(Game::food_counter !=0 && Game::food_counter%4 == 0){
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/kotero.bmp")), NULL, &block);
  }
  else if (Game::food_counter !=0 && Game::food_counter%9 == 0)
  {
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/elikoptero.bmp")), NULL, &block);
  }
  else
  {
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/cash.bmp")), NULL, &block);
  } 

  // Render snake's body
  SDL_SetRenderDrawColor(sdl_renderer, 234, 170, 0, 255);
  for (SDL_Point const &point : snake.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake's head
  block.x = static_cast<int>(snake.head_x) * block.w;
  block.y = static_cast<int>(snake.head_y) * block.h;

  if (snake.alive) {

      
    switch (snake.direction) 
    {
      case Snake::Direction::kUp:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-top.bmp")), NULL, &block);
        break;
      case Snake::Direction::kRight:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-right.bmp")), NULL, &block);
        break;
      case Snake::Direction::kDown:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-down.bmp")), NULL, &block);
        break;
      case Snake::Direction::kLeft:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-left.bmp")), NULL, &block);
        break;
    }
    
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
    SDL_RenderFillRect(sdl_renderer, &block);
  }


  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}